

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O0

void anon_unknown.dwarf_13acd4::Equalizer_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  
  switch(in_ESI) {
  case 1:
    *in_RDX = in_RDI[1];
    break;
  case 2:
    *in_RDX = *in_RDI;
    break;
  case 3:
    *in_RDX = in_RDI[3];
    break;
  case 4:
    *in_RDX = in_RDI[2];
    break;
  case 5:
    *in_RDX = in_RDI[4];
    break;
  case 6:
    *in_RDX = in_RDI[6];
    break;
  case 7:
    *in_RDX = in_RDI[5];
    break;
  case 8:
    *in_RDX = in_RDI[7];
    break;
  case 9:
    *in_RDX = in_RDI[9];
    break;
  case 10:
    *in_RDX = in_RDI[8];
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid equalizer float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  return;
}

Assistant:

void Equalizer_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_EQUALIZER_LOW_GAIN:
        *val = props->Equalizer.LowGain;
        break;

    case AL_EQUALIZER_LOW_CUTOFF:
        *val = props->Equalizer.LowCutoff;
        break;

    case AL_EQUALIZER_MID1_GAIN:
        *val = props->Equalizer.Mid1Gain;
        break;

    case AL_EQUALIZER_MID1_CENTER:
        *val = props->Equalizer.Mid1Center;
        break;

    case AL_EQUALIZER_MID1_WIDTH:
        *val = props->Equalizer.Mid1Width;
        break;

    case AL_EQUALIZER_MID2_GAIN:
        *val = props->Equalizer.Mid2Gain;
        break;

    case AL_EQUALIZER_MID2_CENTER:
        *val = props->Equalizer.Mid2Center;
        break;

    case AL_EQUALIZER_MID2_WIDTH:
        *val = props->Equalizer.Mid2Width;
        break;

    case AL_EQUALIZER_HIGH_GAIN:
        *val = props->Equalizer.HighGain;
        break;

    case AL_EQUALIZER_HIGH_CUTOFF:
        *val = props->Equalizer.HighCutoff;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid equalizer float property 0x%04x", param};
    }
}